

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

nh_option_desc * clone_optlist(nh_option_desc *in)

{
  long *plVar1;
  int iVar2;
  char *__s;
  nh_autopickup_rules *in_00;
  char **ppcVar3;
  uint uVar4;
  nh_option_desc *pnVar5;
  nh_msgtype_rules *pnVar6;
  long lVar7;
  
  uVar4 = 0;
  pnVar5 = in;
  do {
    uVar4 = uVar4 + 1;
    ppcVar3 = &pnVar5->name;
    pnVar5 = pnVar5 + 1;
  } while (*ppcVar3 != (char *)0x0);
  pnVar5 = (nh_option_desc *)malloc((ulong)uVar4 * 0x30);
  memcpy(pnVar5,in,(ulong)uVar4 * 0x30);
  if (in->name != (char *)0x0) {
    lVar7 = 0x18;
    do {
      iVar2 = *(int *)((long)in + lVar7 + -8);
      if (iVar2 == 5) {
        pnVar6 = *(nh_msgtype_rules **)((long)&in->name + lVar7);
        if (pnVar6 != (nh_msgtype_rules *)0x0) {
          pnVar6 = copy_msgtype_rules(pnVar6);
          goto LAB_00209a4e;
        }
      }
      else if (iVar2 == 4) {
        in_00 = *(nh_autopickup_rules **)((long)&in->name + lVar7);
        if (in_00 != (nh_autopickup_rules *)0x0) {
          pnVar6 = (nh_msgtype_rules *)copy_autopickup_rules(in_00);
          goto LAB_00209a4e;
        }
      }
      else if ((iVar2 == 3) && (__s = *(char **)((long)&in->name + lVar7), __s != (char *)0x0)) {
        pnVar6 = (nh_msgtype_rules *)strdup(__s);
LAB_00209a4e:
        *(nh_msgtype_rules **)((long)&pnVar5->name + lVar7) = pnVar6;
      }
      plVar1 = (long *)((long)&in->value + lVar7);
      lVar7 = lVar7 + 0x30;
    } while (*plVar1 != 0);
  }
  return pnVar5;
}

Assistant:

struct nh_option_desc *clone_optlist(const struct nh_option_desc *in)
{
	int i;
	struct nh_option_desc *out;
	
	for (i = 0; in[i].name; i++)
	    ;
	i++;
	out = malloc(sizeof(struct nh_option_desc) * i);
	memcpy(out, in, sizeof(struct nh_option_desc) * i);
	
	for (i = 0; in[i].name; i++) {
	    if (in[i].type == OPTTYPE_STRING && in[i].value.s)
		out[i].value.s = strdup(in[i].value.s);
	    else if (in[i].type == OPTTYPE_AUTOPICKUP_RULES && in[i].value.ar)
		out[i].value.ar = copy_autopickup_rules(in[i].value.ar);
	    else if (in[i].type == OPTTYPE_MSGTYPE && in[i].value.mt)
		out[i].value.mt = copy_msgtype_rules(in[i].value.mt);
	}
	
	return out;
}